

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r,secp256k1_ge_storage *pre,int n,int w)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  undefined4 in_register_0000000c;
  secp256k1_ge *a;
  ulong uVar9;
  ulong uVar10;
  code *extraout_RDX;
  secp256k1_fe *a_00;
  ulong uVar11;
  secp256k1_gej *a_01;
  ulong uVar12;
  ulong uVar13;
  secp256k1_scalar *ng;
  secp256k1_gej *r_00;
  ulong uVar14;
  secp256k1_gej *psVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  secp256k1_fe *psVar19;
  ulong uVar20;
  secp256k1_gej *a_02;
  secp256k1_strauss_state sStack_df0;
  secp256k1_scalar sStack_dd8;
  secp256k1_gej sStack_db8;
  secp256k1_gej sStack_d20;
  secp256k1_ge sStack_c88;
  secp256k1_fe asStack_c20 [8];
  secp256k1_ge asStack_aa0 [8];
  secp256k1_strauss_point_state sStack_760;
  secp256k1_gej *psStack_348;
  ulong uStack_340;
  ulong uStack_338;
  secp256k1_gej *psStack_330;
  secp256k1_modinv64_signed62 *psStack_328;
  code *pcStack_320;
  long lStack_310;
  ulong uStack_308;
  secp256k1_modinv64_signed62 sStack_300;
  secp256k1_fe sStack_2d8;
  secp256k1_gej *psStack_2a0;
  secp256k1_gej *psStack_298;
  secp256k1_fe *psStack_290;
  secp256k1_gej *psStack_288;
  secp256k1_gej *psStack_280;
  secp256k1_fe *psStack_278;
  secp256k1_fe *psStack_268;
  undefined1 auStack_260 [56];
  uint64_t uStack_228;
  uint64_t uStack_220;
  uint64_t uStack_218;
  ulong uStack_210;
  ulong uStack_208;
  undefined1 auStack_200 [56];
  uint64_t uStack_1c8;
  uint64_t uStack_1c0;
  uint64_t uStack_1b8;
  ulong uStack_1b0;
  ulong uStack_1a8;
  undefined1 auStack_1a0 [56];
  uint64_t uStack_168;
  uint64_t uStack_160;
  uint64_t uStack_158;
  uint64_t uStack_150;
  int iStack_148;
  secp256k1_fe sStack_140;
  secp256k1_fe sStack_110;
  secp256k1_fe sStack_e0;
  secp256k1_fe sStack_b0;
  uint64_t uStack_80;
  uint64_t uStack_78;
  uint64_t uStack_70;
  uint64_t uStack_68;
  secp256k1_fe *psStack_60;
  int iStack_58;
  int iStack_54;
  undefined8 uVar8;
  
  psVar19 = (secp256k1_fe *)CONCAT44(in_register_0000000c,w);
  if ((n & 1U) == 0) {
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_00150e20:
    secp256k1_ecmult_table_get_ge_storage_cold_1();
  }
  else {
    if (n < -0x3fff) goto LAB_00150e20;
    if (n < 0x4000) {
      if (0 < n) {
        secp256k1_ge_from_storage(r,pre + (n - 1U >> 1));
        return;
      }
      secp256k1_ge_from_storage(r,pre + ((uint)~n >> 1));
      psVar19 = &r->y;
      secp256k1_fe_verify(psVar19);
      secp256k1_fe_verify_magnitude(psVar19,1);
      uVar2 = (r->y).n[1];
      uVar3 = (r->y).n[2];
      uVar4 = (r->y).n[3];
      (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
      (r->y).n[1] = 0x3ffffffffffffc - uVar2;
      (r->y).n[2] = 0x3ffffffffffffc - uVar3;
      (r->y).n[3] = 0x3ffffffffffffc - uVar4;
      (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
      (r->y).magnitude = 2;
      (r->y).normalized = 0;
      secp256k1_fe_verify(psVar19);
      return;
    }
  }
  secp256k1_ecmult_table_get_ge_storage_cold_2();
  psStack_278 = (secp256k1_fe *)0x150e4f;
  secp256k1_gej_verify((secp256k1_gej *)pre);
  psStack_278 = (secp256k1_fe *)0x150e57;
  secp256k1_ge_verify(a);
  psStack_278 = (secp256k1_fe *)0x150e5f;
  secp256k1_fe_verify(psVar19);
  if (((secp256k1_gej *)pre)->infinity != 0) {
    ((secp256k1_gej *)r)->infinity = a->infinity;
    psStack_278 = (secp256k1_fe *)0x150e8b;
    secp256k1_fe_sqr(&sStack_140,psVar19);
    psStack_278 = (secp256k1_fe *)0x150ea1;
    secp256k1_fe_mul(&sStack_b0,&sStack_140,psVar19);
    psStack_278 = (secp256k1_fe *)0x150eaf;
    secp256k1_fe_mul(&r->x,&a->x,&sStack_140);
    psStack_278 = (secp256k1_fe *)0x150ec2;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->y,&a->y,&sStack_b0);
    pre = (secp256k1_ge_storage *)&((secp256k1_gej *)r)->z;
    (((secp256k1_gej *)r)->z).n[0] = 1;
    (((secp256k1_gej *)r)->z).n[1] = 0;
    (((secp256k1_gej *)r)->z).n[2] = 0;
    (((secp256k1_gej *)r)->z).n[3] = 0;
    (((secp256k1_gej *)r)->z).n[4] = 0;
    (((secp256k1_gej *)r)->z).magnitude = 1;
    (((secp256k1_gej *)r)->z).normalized = 1;
LAB_00150eed:
    psStack_278 = (secp256k1_fe *)0x150ef2;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psStack_278 = (secp256k1_fe *)0x150efa;
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  if (a->infinity != 0) {
    memcpy(r,pre,0x98);
    return;
  }
  psStack_268 = &((secp256k1_gej *)pre)->z;
  psStack_278 = (secp256k1_fe *)0x150f51;
  secp256k1_fe_mul(&sStack_140,psStack_268,psVar19);
  psVar19 = &sStack_b0;
  psStack_278 = (secp256k1_fe *)0x150f64;
  secp256k1_fe_sqr(psVar19,&sStack_140);
  sStack_e0.n[0] = (((secp256k1_gej *)pre)->x).n[0];
  sStack_e0.n[1] = (((secp256k1_gej *)pre)->x).n[1];
  sStack_e0.n[2] = (((secp256k1_gej *)pre)->x).n[2];
  sStack_e0.n[3] = (((secp256k1_gej *)pre)->x).n[3];
  sStack_e0.n[4] = (((secp256k1_gej *)pre)->x).n[4];
  sStack_e0.magnitude = (((secp256k1_gej *)pre)->x).magnitude;
  sStack_e0.normalized = (((secp256k1_gej *)pre)->x).normalized;
  a_00 = &sStack_e0;
  psStack_278 = (secp256k1_fe *)0x150f99;
  secp256k1_fe_mul((secp256k1_fe *)(auStack_1a0 + 0x30),&a->x,psVar19);
  auStack_200._0_8_ = (((secp256k1_gej *)pre)->y).n[0];
  auStack_200._8_8_ = (((secp256k1_gej *)pre)->y).n[1];
  auStack_200._16_8_ = (((secp256k1_gej *)pre)->y).n[2];
  auStack_200._24_8_ = (((secp256k1_gej *)pre)->y).n[3];
  auStack_200._32_8_ = (((secp256k1_gej *)pre)->y).n[4];
  auStack_200._40_4_ = (((secp256k1_gej *)pre)->y).magnitude;
  auStack_200._44_4_ = (((secp256k1_gej *)pre)->y).normalized;
  psStack_278 = (secp256k1_fe *)0x150fd7;
  secp256k1_fe_mul(&sStack_110,&a->y,psVar19);
  psStack_278 = (secp256k1_fe *)0x150fea;
  secp256k1_fe_mul(&sStack_110,&sStack_110,&sStack_140);
  psStack_278 = (secp256k1_fe *)0x150ff2;
  secp256k1_fe_verify(a_00);
  a_01 = (secp256k1_gej *)0x4;
  psStack_278 = (secp256k1_fe *)0x150fff;
  secp256k1_fe_verify_magnitude(a_00,4);
  auStack_200._48_8_ = 0x9ffff5ffffd9d6 - sStack_e0.n[0];
  uStack_1c8 = 0x9ffffffffffff6 - sStack_e0.n[1];
  a_02 = (secp256k1_gej *)(auStack_200 + 0x30);
  uStack_1c0 = 0x9ffffffffffff6 - sStack_e0.n[2];
  uStack_1b8 = 0x9ffffffffffff6 - sStack_e0.n[3];
  uStack_1b0 = 0x9fffffffffff6 - sStack_e0.n[4];
  uStack_1a8 = 5;
  psStack_278 = (secp256k1_fe *)0x15104e;
  secp256k1_fe_verify((secp256k1_fe *)a_02);
  psStack_278 = (secp256k1_fe *)0x151056;
  secp256k1_fe_verify((secp256k1_fe *)a_02);
  psVar15 = (secp256k1_gej *)(auStack_1a0 + 0x30);
  psStack_278 = (secp256k1_fe *)0x151066;
  r_00 = psVar15;
  secp256k1_fe_verify((secp256k1_fe *)psVar15);
  if (iStack_148 + (int)uStack_1a8 < 0x21) {
    auStack_200._48_8_ = auStack_200._48_8_ + auStack_1a0._48_8_;
    uStack_1c8 = uStack_1c8 + uStack_168;
    uStack_1c0 = uStack_1c0 + uStack_160;
    uStack_1b8 = uStack_1b8 + uStack_158;
    uStack_1b0 = uStack_1b0 + uStack_150;
    psVar19 = (secp256k1_fe *)0x3fffffffffffc;
    uStack_1a8 = (ulong)(uint)(iStack_148 + (int)uStack_1a8);
    psStack_278 = (secp256k1_fe *)0x1510c9;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
    psStack_278 = (secp256k1_fe *)0x1510d9;
    secp256k1_fe_verify(&sStack_110);
    a_01 = (secp256k1_gej *)0x1;
    psStack_278 = (secp256k1_fe *)0x1510e6;
    secp256k1_fe_verify_magnitude(&sStack_110,1);
    auStack_260._48_8_ = 0x3ffffbfffff0bc - sStack_110.n[0];
    uStack_228 = 0x3ffffffffffffc - sStack_110.n[1];
    psVar15 = (secp256k1_gej *)(auStack_260 + 0x30);
    uStack_220 = 0x3ffffffffffffc - sStack_110.n[2];
    uStack_218 = 0x3ffffffffffffc - sStack_110.n[3];
    uStack_210 = 0x3fffffffffffc - sStack_110.n[4];
    uStack_208 = 2;
    psStack_278 = (secp256k1_fe *)0x151130;
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    psStack_278 = (secp256k1_fe *)0x151138;
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    a_02 = (secp256k1_gej *)auStack_200;
    psStack_278 = (secp256k1_fe *)0x151145;
    r_00 = a_02;
    secp256k1_fe_verify((secp256k1_fe *)a_02);
    if (0x20 < auStack_200._40_4_ + (int)uStack_208) goto LAB_00151611;
    auStack_260._48_8_ = auStack_260._48_8_ + auStack_200._0_8_;
    uStack_228 = uStack_228 + auStack_200._8_8_;
    uStack_220 = uStack_220 + auStack_200._16_8_;
    uStack_218 = uStack_218 + auStack_200._24_8_;
    uStack_210 = uStack_210 + auStack_200._32_8_;
    uStack_208 = (ulong)(uint)(auStack_200._40_4_ + (int)uStack_208);
    psStack_278 = (secp256k1_fe *)0x1511ac;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_260 + 0x30));
    psStack_278 = (secp256k1_fe *)0x1511bc;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
    a_00 = (secp256k1_fe *)0x1000003d1;
    uVar6 = (uStack_1b0 >> 0x30) * 0x1000003d1 + auStack_200._48_8_;
    if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
      uVar9 = (uVar6 >> 0x34) + uStack_1c8;
      uVar12 = (uVar9 >> 0x34) + uStack_1c0;
      uVar14 = (uVar12 >> 0x34) + uStack_1b8;
      uVar16 = (uVar14 >> 0x34) + (uStack_1b0 & 0xffffffffffff);
      if ((((uVar9 | uVar6 | uVar12 | uVar14) & 0xfffffffffffff) == 0 && uVar16 == 0) ||
         (((uVar6 | 0x1000003d0) & uVar9 & uVar12 & uVar14 & (uVar16 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_278 = (secp256k1_fe *)0x15154e;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_260 + 0x30));
        uVar6 = (uStack_210 >> 0x30) * 0x1000003d1 + auStack_260._48_8_;
        if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
          uVar9 = (uVar6 >> 0x34) + uStack_228;
          uVar12 = (uVar9 >> 0x34) + uStack_220;
          uVar14 = (uVar12 >> 0x34) + uStack_218;
          uVar16 = (uVar14 >> 0x34) + (uStack_210 & 0xffffffffffff);
          if ((((uVar9 | uVar6 | uVar12 | uVar14) & 0xfffffffffffff) == 0 && uVar16 == 0) ||
             (((uVar6 | 0x1000003d0) & uVar9 & uVar12 & uVar14 & (uVar16 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            psStack_278 = (secp256k1_fe *)0x151607;
            secp256k1_gej_double_var((secp256k1_gej *)r,(secp256k1_gej *)pre,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_278 = (secp256k1_fe *)0x1515f5;
        secp256k1_gej_set_infinity((secp256k1_gej *)r);
        return;
      }
    }
    ((secp256k1_gej *)r)->infinity = 0;
    a_02 = (secp256k1_gej *)(auStack_200 + 0x30);
    psStack_278 = (secp256k1_fe *)0x151299;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->z,psStack_268,(secp256k1_fe *)a_02);
    pre = (secp256k1_ge_storage *)&stack0xffffffffffffff80;
    psStack_278 = (secp256k1_fe *)0x1512ac;
    secp256k1_fe_sqr((secp256k1_fe *)pre,(secp256k1_fe *)a_02);
    psStack_278 = (secp256k1_fe *)0x1512b4;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psStack_278 = (secp256k1_fe *)0x1512c1;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)pre,1);
    uStack_80 = 0x3ffffbfffff0bc - uStack_80;
    uStack_78 = 0x3ffffffffffffc - uStack_78;
    uStack_70 = 0x3ffffffffffffc - uStack_70;
    uStack_68 = 0x3ffffffffffffc - uStack_68;
    psVar19 = (secp256k1_fe *)(0x3fffffffffffc - (long)psStack_60);
    iStack_58 = 2;
    iStack_54 = 0;
    psStack_278 = (secp256k1_fe *)0x1512ff;
    psStack_60 = psVar19;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psVar15 = (secp256k1_gej *)auStack_260;
    psStack_278 = (secp256k1_fe *)0x151312;
    secp256k1_fe_mul((secp256k1_fe *)psVar15,(secp256k1_fe *)pre,(secp256k1_fe *)a_02);
    psStack_278 = (secp256k1_fe *)0x15132a;
    secp256k1_fe_mul((secp256k1_fe *)auStack_1a0,&sStack_e0,(secp256k1_fe *)pre);
    a_01 = (secp256k1_gej *)(auStack_260 + 0x30);
    psStack_278 = (secp256k1_fe *)0x151337;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)a_01);
    psStack_278 = (secp256k1_fe *)0x15133f;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_fe *)0x151347;
    r_00 = psVar15;
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    iVar5 = auStack_260._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar5) goto LAB_00151616;
    uVar2 = (((secp256k1_gej *)r)->x).n[1];
    uVar3 = (((secp256k1_gej *)r)->x).n[2];
    uVar4 = (((secp256k1_gej *)r)->x).n[3];
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_260._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar2 + auStack_260._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar3 + auStack_260._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar4 + auStack_260._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_260._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar5;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_278 = (secp256k1_fe *)0x151391;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_fe *)0x151399;
    secp256k1_fe_verify(&r->x);
    pre = (secp256k1_ge_storage *)auStack_1a0;
    psStack_278 = (secp256k1_fe *)0x1513a9;
    r_00 = (secp256k1_gej *)pre;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    iVar5 = auStack_1a0._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar5) goto LAB_0015161b;
    uVar2 = (((secp256k1_gej *)r)->x).n[1];
    uVar3 = (((secp256k1_gej *)r)->x).n[2];
    uVar4 = (((secp256k1_gej *)r)->x).n[3];
    pre = (secp256k1_ge_storage *)auStack_1a0;
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar2 + auStack_1a0._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar3 + auStack_1a0._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar4 + auStack_1a0._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_1a0._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar5;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_278 = (secp256k1_fe *)0x1513f8;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_fe *)0x151400;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_fe *)0x151408;
    r_00 = (secp256k1_gej *)pre;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    iVar5 = auStack_1a0._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar5) goto LAB_00151620;
    uVar2 = (((secp256k1_gej *)r)->x).n[1];
    uVar3 = (((secp256k1_gej *)r)->x).n[2];
    uVar4 = (((secp256k1_gej *)r)->x).n[3];
    pre = (secp256k1_ge_storage *)auStack_1a0;
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar2 + auStack_1a0._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar3 + auStack_1a0._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar4 + auStack_1a0._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_1a0._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar5;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_278 = (secp256k1_fe *)0x151457;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_fe *)0x15145f;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psStack_278 = (secp256k1_fe *)0x151467;
    r_00 = (secp256k1_gej *)r;
    secp256k1_fe_verify(&r->x);
    iVar5 = (((secp256k1_gej *)r)->x).magnitude + auStack_1a0._40_4_;
    if (iVar5 < 0x21) {
      auStack_1a0._0_8_ = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
      auStack_1a0._8_8_ = (((secp256k1_gej *)r)->x).n[1] + auStack_1a0._8_8_;
      auStack_1a0._16_8_ = (((secp256k1_gej *)r)->x).n[2] + auStack_1a0._16_8_;
      auStack_1a0._24_8_ = (((secp256k1_gej *)r)->x).n[3] + auStack_1a0._24_8_;
      auStack_1a0._32_8_ = auStack_1a0._32_8_ + (((secp256k1_gej *)r)->x).n[4];
      auStack_1a0._44_4_ = 0;
      psStack_278 = (secp256k1_fe *)0x1514ba;
      auStack_1a0._40_4_ = iVar5;
      secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
      pre = (secp256k1_ge_storage *)&((secp256k1_gej *)r)->y;
      psStack_278 = (secp256k1_fe *)0x1514ce;
      secp256k1_fe_mul((secp256k1_fe *)pre,(secp256k1_fe *)auStack_1a0,
                       (secp256k1_fe *)(auStack_260 + 0x30));
      a_02 = (secp256k1_gej *)auStack_260;
      psStack_278 = (secp256k1_fe *)0x1514e3;
      a_01 = a_02;
      secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)a_02,(secp256k1_fe *)auStack_200);
      psStack_278 = (secp256k1_fe *)0x1514eb;
      secp256k1_fe_verify((secp256k1_fe *)pre);
      psStack_278 = (secp256k1_fe *)0x1514f3;
      r_00 = a_02;
      secp256k1_fe_verify((secp256k1_fe *)a_02);
      iVar5 = auStack_260._40_4_ + (((secp256k1_gej *)r)->y).magnitude;
      if (iVar5 < 0x21) {
        uVar2 = (((secp256k1_gej *)r)->y).n[1];
        uVar3 = (((secp256k1_gej *)r)->y).n[2];
        uVar4 = (((secp256k1_gej *)r)->y).n[3];
        (((secp256k1_gej *)r)->y).n[0] = (((secp256k1_gej *)r)->y).n[0] + auStack_260._0_8_;
        (((secp256k1_gej *)r)->y).n[1] = uVar2 + auStack_260._8_8_;
        (((secp256k1_gej *)r)->y).n[2] = uVar3 + auStack_260._16_8_;
        (((secp256k1_gej *)r)->y).n[3] = uVar4 + auStack_260._24_8_;
        puVar1 = (((secp256k1_gej *)r)->y).n + 4;
        *puVar1 = *puVar1 + auStack_260._32_8_;
        (((secp256k1_gej *)r)->y).magnitude = iVar5;
        (((secp256k1_gej *)r)->y).normalized = 0;
        goto LAB_00150eed;
      }
      goto LAB_0015162a;
    }
  }
  else {
    psStack_278 = (secp256k1_fe *)0x151611;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00151611:
    psStack_278 = (secp256k1_fe *)0x151616;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_00151616:
    psStack_278 = (secp256k1_fe *)0x15161b;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0015161b:
    psStack_278 = (secp256k1_fe *)0x151620;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_00151620:
    psStack_278 = (secp256k1_fe *)0x151625;
    secp256k1_gej_add_zinv_var_cold_3();
  }
  psStack_278 = (secp256k1_fe *)0x15162a;
  secp256k1_gej_add_zinv_var_cold_2();
LAB_0015162a:
  psStack_278 = (secp256k1_fe *)secp256k1_fe_inv_var;
  secp256k1_gej_add_zinv_var_cold_1();
  pcStack_320 = (code *)0x15164b;
  psStack_2a0 = (secp256k1_gej *)r;
  psStack_298 = psVar15;
  psStack_290 = psVar19;
  psStack_288 = (secp256k1_gej *)pre;
  psStack_280 = a_02;
  psStack_278 = a_00;
  secp256k1_fe_verify(&a_01->x);
  uVar6 = (a_01->x).n[4];
  lStack_310 = 0x1000003d1;
  uVar9 = (uVar6 >> 0x30) * 0x1000003d1 + (a_01->x).n[0];
  uVar20 = (uVar9 >> 0x34) + (a_01->x).n[1];
  uVar14 = (uVar20 >> 0x34) + (a_01->x).n[2];
  uVar16 = (uVar14 >> 0x34) + (a_01->x).n[3];
  uStack_308 = (uVar16 >> 0x34) + (uVar6 & 0xffffffffffff);
  uVar11 = (uVar9 ^ 0x1000003d0) & uVar20 & uVar14 & uVar16 & (uStack_308 ^ 0xf000000000000);
  pcStack_320 = (code *)0x1516e8;
  secp256k1_fe_verify(&a_01->x);
  sStack_2d8.n[0] = (a_01->x).n[0];
  sStack_2d8.n[1] = (a_01->x).n[1];
  sStack_2d8.n[2] = (a_01->x).n[2];
  sStack_2d8.n[3] = (a_01->x).n[3];
  sStack_2d8.n[4] = (a_01->x).n[4];
  sStack_2d8.magnitude = (a_01->x).magnitude;
  sStack_2d8.normalized = (a_01->x).normalized;
  pcStack_320 = (code *)0x151711;
  secp256k1_fe_normalize_var(&sStack_2d8);
  sStack_300.v[0] = (sStack_2d8.n[1] << 0x34 | sStack_2d8.n[0]) & 0x3fffffffffffffff;
  uVar17 = (ulong)((uint)sStack_2d8.n[2] & 0xfffff) << 0x2a | sStack_2d8.n[1] >> 10;
  sStack_300.v[2] = (ulong)((uint)sStack_2d8.n[3] & 0x3fffffff) << 0x20 | sStack_2d8.n[2] >> 0x14;
  sStack_300.v[3] = (sStack_2d8.n[4] & 0xffffffffff) << 0x16 | sStack_2d8.n[3] >> 0x1e;
  sStack_300.v[4] = sStack_2d8.n[4] >> 0x28;
  pcStack_320 = (code *)0x1517a3;
  sStack_300.v[1] = uVar17;
  secp256k1_modinv64_var(&sStack_300,&secp256k1_const_modinfo_fe);
  pcStack_320 = (code *)0x1517ae;
  secp256k1_fe_from_signed62(&r_00->x,&sStack_300);
  (r_00->x).magnitude = (uint)(0 < (a_01->x).magnitude);
  (r_00->x).normalized = 1;
  pcStack_320 = (code *)0x1517ca;
  secp256k1_fe_verify(&r_00->x);
  uVar6 = (r_00->x).n[4];
  psVar15 = (secp256k1_gej *)(uVar6 & 0xffffffffffff);
  uVar12 = (uVar6 >> 0x30) * lStack_310 + (r_00->x).n[0];
  uVar6 = (uVar12 >> 0x34) + (r_00->x).n[1];
  uVar10 = (uVar6 >> 0x34) + (r_00->x).n[2];
  uVar13 = (uVar10 >> 0x34) + (r_00->x).n[3];
  ng = (secp256k1_scalar *)((long)(psVar15->x).n + (uVar13 >> 0x34));
  uVar18 = (uVar12 ^ 0x1000003d0) & uVar6 & uVar10 & uVar13 & ((ulong)ng ^ 0xf000000000000);
  bVar7 = uVar18 == 0xfffffffffffff ||
          ((uVar6 | uVar12 | uVar10 | uVar13) & 0xfffffffffffff) == 0 &&
          ng == (secp256k1_scalar *)0x0;
  uVar8 = CONCAT71(0xfffffffffff,bVar7);
  uVar6 = (uVar20 | uVar9 | uVar14 | uVar16) & 0xfffffffffffff | uStack_308;
  if ((uVar11 != 0xfffffffffffff && uVar6 != 0) != bVar7) {
    secp256k1_fe_verify(&r_00->x);
    return;
  }
  pcStack_320 = secp256k1_ecmult_multi_simple_var;
  secp256k1_fe_inv_var_cold_1();
  psStack_348 = r_00;
  uStack_340 = uVar18;
  uStack_338 = uVar6;
  psStack_330 = a_01;
  psStack_328 = &sStack_300;
  pcStack_320 = (code *)uVar11;
  secp256k1_gej_set_infinity(psVar15);
  secp256k1_gej_set_infinity(&sStack_d20);
  sStack_db8.x.n[0] = (uint64_t)asStack_c20;
  sStack_db8.x.n[1] = (uint64_t)asStack_aa0;
  sStack_db8.x.n[2] = (uint64_t)&sStack_760;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_db8,psVar15,1,&sStack_d20,&secp256k1_scalar_zero,ng)
  ;
  if (uVar17 != 0) {
    uVar6 = 0;
    do {
      iVar5 = (*extraout_RDX)(&sStack_dd8,&sStack_c88,uVar6,uVar8);
      if (iVar5 == 0) {
        return;
      }
      secp256k1_gej_set_ge(&sStack_db8,&sStack_c88);
      sStack_df0.aux = asStack_c20;
      sStack_df0.pre_a = asStack_aa0;
      sStack_df0.ps = &sStack_760;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_df0,&sStack_d20,1,&sStack_db8,&sStack_dd8,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(psVar15,psVar15,&sStack_d20,(secp256k1_fe *)0x0);
      uVar6 = uVar6 + 1;
    } while (uVar17 != uVar6);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r, const secp256k1_ge_storage *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        secp256k1_ge_from_storage(r, &pre[(n-1)/2]);
    } else {
        secp256k1_ge_from_storage(r, &pre[(-n-1)/2]);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}